

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

uint openjtalk_getHTSVoiceCount(OpenJTalk *oj,HtsVoiceFilelist *list)

{
  uint counter;
  HtsVoiceFilelist *list_local;
  OpenJTalk *oj_local;
  uint local_4;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    local_4 = 0;
  }
  else {
    counter = 0;
    for (list_local = list; list_local != (HtsVoiceFilelist *)0x0; list_local = list_local->succ) {
      counter = counter + 1;
    }
    local_4 = counter;
  }
  return local_4;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getHTSVoiceCount(OpenJTalk *oj, HtsVoiceFilelist *list)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0;
	}

	unsigned int counter = 0;
	while (list)
	{
		counter++;
		list = list->succ;
	}

	return counter;
}